

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O2

TiXmlNode * __thiscall
despot::util::tinyxml::TiXmlNode::IterateChildren(TiXmlNode *this,char *val,TiXmlNode *previous)

{
  TiXmlNode *pTVar1;
  
  if (previous == (TiXmlNode *)0x0) {
    pTVar1 = FirstChild(this,val);
    return pTVar1;
  }
  if (previous->parent == this) {
    pTVar1 = NextSibling(previous,val);
    return pTVar1;
  }
  __assert_fail("previous->parent == this",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxml.cpp"
                ,0x14e,
                "const TiXmlNode *despot::util::tinyxml::TiXmlNode::IterateChildren(const char *, const TiXmlNode *) const"
               );
}

Assistant:

const TiXmlNode* TiXmlNode::IterateChildren(const char * val,
	const TiXmlNode* previous) const {
	if (!previous) {
		return FirstChild(val);
	} else {
		assert(previous->parent == this);
		return previous->NextSibling(val);
	}
}